

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AuxiliaryStmt *stmt)

{
  undefined1 *puVar1;
  UserException *this_00;
  ostream *poVar2;
  string_view sVar3;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  code *local_58;
  code *local_50;
  string local_48;
  
  if (stmt->type_ != Delay) {
    if (stmt->type_ != EventTracing) {
      return;
    }
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Auxiliary event tracing statement should not be in the codegen!"
               ,(allocator<char> *)(local_78 + 0x10));
    UserException::UserException(this_00,&local_48);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar3 = indent(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,sVar3._M_str,sVar3._M_len);
  Stmt::as<kratos::EventDelayStmt>((Stmt *)local_78);
  if (*(int *)(local_78._0_8_ + 0xd8) == 1) {
    poVar2 = std::operator<<((ostream *)puVar1,"@(");
    local_68._8_8_ = (pointer)0x0;
    local_50 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
               ::_M_manager;
    local_68._0_8_ = this;
    EventControl::to_string
              (&local_48,(EventControl *)(local_78._0_8_ + 200),
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)(local_78 + 0x10));
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2,')');
  }
  else {
    if (*(int *)(local_78._0_8_ + 0xd8) != 0) goto LAB_0015a2a2;
    local_68._8_8_ = (pointer)0x0;
    local_50 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
               ::_M_manager;
    local_68._0_8_ = this;
    EventControl::to_string
              (&local_48,(EventControl *)(local_78._0_8_ + 200),
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)(local_78 + 0x10));
    std::operator<<((ostream *)puVar1,(string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)(local_78 + 0x10));
LAB_0015a2a2:
  poVar2 = std::operator<<((ostream *)puVar1,';');
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar2,'\n');
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AuxiliaryStmt* stmt) {
    switch (stmt->aux_type()) {
        case AuxiliaryType::EventTracing: {
            throw UserException("Auxiliary event tracing statement should not be in the codegen!");
        }
        case AuxiliaryType::Delay: {
            stream_ << indent();
            auto const& delay = stmt->as<EventDelayStmt>();
            auto const& event = delay->event();
            auto var_func = [this](const Var* var) { return stream_.var_str(var); };
            switch (event.type) {
                case EventControlType::Delay: {
                    stream_ << event.to_string(var_func);
                    break;
                }
                case EventControlType::Edge: {
                    stream_ << "@(" << event.to_string(var_func) << ')';
                    break;
                }
            }
            stream_ << ';' << stream_.endl();
        }
    }
}